

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabel::focusOutEvent(QLabel *this,QFocusEvent *ev)

{
  QLabelPrivate *this_00;
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if (this_00->control != (QWidgetTextControl *)0x0) {
    QLabelPrivate::sendControlEvent(this_00,(QEvent *)ev);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::textCursor((QWidgetTextControl *)&local_30);
    iVar2 = QFocusEvent::reason();
    if (iVar2 - 5U < 0xfffffffe) {
      cVar1 = QTextCursor::hasSelection();
      if (cVar1 != '\0') {
        QTextCursor::clearSelection();
        QWidgetTextControl::setTextCursor
                  ((QWidgetTextControl *)this_00->control,(QTextCursor *)&local_30,false);
      }
    }
    QTextCursor::~QTextCursor((QTextCursor *)&local_30);
  }
  QWidget::focusOutEvent((QWidget *)this,ev);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::focusOutEvent(QFocusEvent *ev)
{
    Q_D(QLabel);
    if (d->control) {
        d->sendControlEvent(ev);
        QTextCursor cursor = d->control->textCursor();
        Qt::FocusReason reason = ev->reason();
        if (reason != Qt::ActiveWindowFocusReason
            && reason != Qt::PopupFocusReason
            && cursor.hasSelection()) {
            cursor.clearSelection();
            d->control->setTextCursor(cursor);
        }
    }

    QFrame::focusOutEvent(ev);
}